

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLUri::XMLUri(XMLUri *this,XMLUri *baseURI,XMLCh *uriSpec,MemoryManager *manager)

{
  CleanupType_conflict5 cleanup;
  JanitorMemFunCall<xercesc_4_0::XMLUri> local_20;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLUri_003fb3c8;
  this->fPort = -1;
  this->fScheme = (XMLCh *)0x0;
  this->fUserInfo = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fRegAuth = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fQueryString = (XMLCh *)0x0;
  this->fFragment = (XMLCh *)0x0;
  this->fURIText = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  local_20.fToCall = (MFPT)cleanUp;
  local_20._16_8_ = 0;
  local_20.fObject = this;
  initialize(this,baseURI,uriSpec);
  local_20.fObject = (XMLUri *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLUri>::~JanitorMemFunCall(&local_20);
  return;
}

Assistant:

XMLUri::XMLUri(const XMLUri* const      baseURI
              , const XMLCh* const   uriSpec
              , MemoryManager* const manager)
: fPort(-1)
, fScheme(0)
, fUserInfo(0)
, fHost(0)
, fRegAuth(0)
, fPath(0)
, fQueryString(0)
, fFragment(0)
, fURIText(0)
, fMemoryManager(manager)
{
    CleanupType cleanup(this, &XMLUri::cleanUp);

    try {
        initialize(baseURI, uriSpec);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}